

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution-results.h
# Opt level: O1

void __thiscall wasm::ExecutionResults::get(ExecutionResults *this,Module *wasm)

{
  size_t *this_00;
  ModuleRunner **this_01;
  pointer puVar1;
  Export *pEVar2;
  ostream *poVar3;
  Function *func;
  variant<wasm::Name,_wasm::HeapType> *pvVar4;
  _Array_type *linkedInstances;
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  *p_Var5;
  long lVar6;
  Literal *pLVar7;
  pointer puVar8;
  long lVar9;
  __index_type *this_02;
  Name name;
  Name name_00;
  Name NVar10;
  undefined1 local_428 [8];
  ModuleRunner instance;
  LoggingExternalInterface interface;
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  local_e8;
  undefined1 local_b8 [8];
  FunctionResult ret;
  value_type value;
  
  this_00 = &instance.super_ModuleRunnerBase<wasm::ModuleRunner>.linkedInstances._M_t._M_impl.
             super__Rb_tree_header._M_node_count;
  LoggingExternalInterface::LoggingExternalInterface
            ((LoggingExternalInterface *)this_00,&this->loggings,wasm);
  local_e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e8._M_impl.super__Rb_tree_header._M_header;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8._M_impl._0_8_ = 0;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  linkedInstances = (_Array_type *)&local_e8;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
  ModuleRunner::ModuleRunner
            ((ModuleRunner *)local_428,wasm,(ExternalInterface *)this_00,
             (map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
              *)linkedInstances);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  ::~_Rb_tree(&local_e8);
  instance.super_ModuleRunnerBase<wasm::ModuleRunner>.super_ExpressionRunner<wasm::ModuleRunner>.
  depth = 1;
  ModuleRunnerBase<wasm::ModuleRunner>::instantiate
            ((ModuleRunnerBase<wasm::ModuleRunner> *)local_428);
  puVar1 = (wasm->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  interface.jsTag.super_IString.str._M_str = (char *)local_428;
  for (puVar8 = (wasm->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar1; puVar8 = puVar8 + 1) {
    if (((puVar8->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t
         .super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
         super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->kind == Function) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[fuzz-exec] calling ",0x14);
      pEVar2 = (puVar8->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      name.super_IString.str._M_str = (char *)linkedInstances;
      name.super_IString.str._M_len = (size_t)(pEVar2->name).super_IString.str._M_str;
      poVar3 = wasm::operator<<((wasm *)&std::cout,*(ostream **)&(pEVar2->name).super_IString,name);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      pEVar2 = (puVar8->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      pvVar4 = &pEVar2->value;
      if ((pEVar2->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
          super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
          super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
          super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
          super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
          super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_index != '\0') {
        pvVar4 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
      }
      NVar10.super_IString.str._M_str =
           *(char **)&(pvVar4->super__Variant_base<wasm::Name,_wasm::HeapType>).
                      super__Move_assign_alias<wasm::Name,_wasm::HeapType>;
      NVar10.super_IString.str._M_len = (size_t)wasm;
      func = (Function *)::wasm::Module::getFunction(NVar10);
      run((FunctionResult *)local_b8,this,func,wasm,(ModuleRunner *)local_428);
      ret.
      super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
      .
      super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
      .
      super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
      .
      super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
      .
      super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
      .
      super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
      ._56_8_ = std::
                map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
                ::operator[](&this->results,
                             &((puVar8->_M_t).
                               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                               .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->name);
      linkedInstances =
           &std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_&>
            ::_S_vtable;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_&>
        ::_S_vtable._M_arr
        [(long)(char)ret.
                     super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     .
                     super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     .
                     super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     .
                     super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     .
                     super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     .
                     super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                     ._M_u._M_first._M_storage._M_storage[0x30] + 1]._M_data)
                ((anon_class_8_1_8991fb9c *)
                 &ret.
                  super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                  .
                  super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                  .
                  super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                  .
                  super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                  .
                  super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                  .
                  super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                  ._M_index,(FunctionResult *)local_b8);
      if ((ret.
           super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           .
           super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           .
           super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           .
           super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           .
           super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           .
           super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           ._M_u._M_first._M_storage._M_storage[0x30] == '\0') &&
         (linkedInstances = (_Array_type *)0xaaaaaaaaaaaaaaab,
         ((long)(ret.
                 super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                 .
                 super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                 .
                 super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                 .
                 super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                 .
                 super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                 .
                 super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                 ._M_u._32_8_ -
                ret.
                super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                .
                super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                .
                super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                .
                super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                .
                super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                .
                super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                ._M_u._24_8_) >> 3) * -0x5555555555555555 + (long)local_b8 != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[fuzz-exec] note result: ",0x19);
        pEVar2 = (puVar8->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        name_00.super_IString.str._M_str = (char *)linkedInstances;
        name_00.super_IString.str._M_len = (size_t)(pEVar2->name).super_IString.str._M_str;
        poVar3 = wasm::operator<<((wasm *)&std::cout,*(ostream **)&(pEVar2->name).super_IString,
                                  name_00);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," => ",4);
        p_Var5 = (_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
                  *)(((long)(ret.
                             super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                             .
                             super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                             .
                             super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                             .
                             super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                             .
                             super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                             .
                             super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                             ._M_u._32_8_ -
                            ret.
                            super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                            .
                            super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                            .
                            super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                            .
                            super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                            .
                            super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                            .
                            super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                            ._M_u._24_8_) >> 3) * -0x5555555555555555 + (long)local_b8);
        linkedInstances = (_Array_type *)p_Var5;
        if (p_Var5 != (_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
                       *)0x0) {
          linkedInstances = (_Array_type *)local_b8;
          lVar9 = -0x18;
          lVar6 = 0;
          do {
            this_02 = &ret.
                       super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                       .
                       super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                       .
                       super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                       .
                       super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                       .
                       super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                       .
                       super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                       ._M_index;
            pLVar7 = (Literal *)
                     (ret.
                      super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                      .
                      super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                      .
                      super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                      .
                      super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                      .
                      super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                      .
                      super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                      ._M_u._24_8_ + lVar9);
            if (lVar6 == 0) {
              pLVar7 = (Literal *)&ret;
            }
            ::wasm::Literal::Literal((Literal *)this_02,pLVar7);
            this_01 = &interface.instance;
            ::wasm::Literal::Literal((Literal *)this_01,(Literal *)this_02);
            printValue(this,(Literal *)this_01);
            ::wasm::Literal::~Literal((Literal *)this_01);
            ::wasm::Literal::~Literal
                      ((Literal *)
                       &ret.
                        super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                        .
                        super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                        .
                        super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                        .
                        super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                        .
                        super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                        .
                        super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                        ._M_index);
            lVar6 = lVar6 + 1;
            lVar9 = lVar9 + 0x18;
          } while (p_Var5 != (_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
                              *)lVar6);
        }
      }
      std::__detail::__variant::
      _Variant_storage<false,_wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
      ::~_Variant_storage((_Variant_storage<false,_wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                           *)local_b8);
    }
  }
  ModuleRunnerBase<wasm::ModuleRunner>::~ModuleRunnerBase
            ((ModuleRunnerBase<wasm::ModuleRunner> *)local_428);
  ShellExternalInterface::~ShellExternalInterface
            ((ShellExternalInterface *)
             &instance.super_ModuleRunnerBase<wasm::ModuleRunner>.linkedInstances._M_t._M_impl.
              super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void get(Module& wasm) {
    LoggingExternalInterface interface(loggings, wasm);
    try {
      ModuleRunner instance(wasm, &interface);
      // This is not an optimization: we want to execute anything, even relaxed
      // SIMD instructions.
      instance.setRelaxedBehavior(ModuleRunner::RelaxedBehavior::Execute);
      instance.instantiate();
      interface.setModuleRunner(&instance);
      // execute all exported methods (that are therefore preserved through
      // opts)
      for (auto& exp : wasm.exports) {
        if (exp->kind != ExternalKind::Function) {
          continue;
        }
        std::cout << "[fuzz-exec] calling " << exp->name << "\n";
        auto* func = wasm.getFunction(*exp->getInternalName());
        FunctionResult ret = run(func, wasm, instance);
        results[exp->name] = ret;
        if (auto* values = std::get_if<Literals>(&ret)) {
          // ignore the result if we hit an unreachable and returned no value
          if (values->size() > 0) {
            std::cout << "[fuzz-exec] note result: " << exp->name << " => ";
            for (auto value : *values) {
              printValue(value);
            }
          }
        }
      }
    } catch (const TrapException&) {
      // May throw in instance creation (init of offsets).
    } catch (const HostLimitException&) {
      // May throw in instance creation (e.g. array.new of huge size).
      // This should be ignored and not compared with, as optimizations can
      // change whether a host limit is reached.
      ignore = true;
    }
  }